

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall Units_removeUnit_Test::~Units_removeUnit_Test(Units_removeUnit_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, removeUnit)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    u->addUnit(libcellml::Units::StandardUnit::AMPERE, "micro");
    u->addUnit("kelvin");
    u->addUnit("siemens", "milli", -1.0);
    u->addUnit("metre", "1.7e10");

    EXPECT_EQ(size_t(4), u->unitCount());
    EXPECT_TRUE(u->removeUnit("siemens"));
    EXPECT_TRUE(u->removeUnit(libcellml::Units::StandardUnit::KELVIN));
    EXPECT_TRUE(u->removeUnit(1));
    EXPECT_EQ(size_t(1), u->unitCount());

    // Remove non-existent unit
    EXPECT_FALSE(u->removeUnit("gram"));
    EXPECT_FALSE(u->removeUnit(libcellml::Units::StandardUnit::BECQUEREL));
    EXPECT_FALSE(u->removeUnit(3));
    EXPECT_EQ(size_t(1), u->unitCount());

    u->removeAllUnits();
    EXPECT_EQ(size_t(0), u->unitCount());
}